

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               uint32_t *validation_data)

{
  Nonnull<const_char_*> pcVar1;
  undefined7 in_register_00000011;
  ExtensionInfo local_60;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                       (type,0xe,"type == WireFormatLite::TYPE_ENUM");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    local_60._15_8_ = 0;
    local_60.field_6._7_1_ = 0;
    local_60.descriptor._0_7_ = 0;
    local_60._39_8_ = 0;
    local_60.lazy_eager_verify_func._7_1_ = 0;
    local_60.field_6._8_7_ = SUB87(validation_data,0);
    local_60.field_6._15_1_ = (undefined1)((ulong)validation_data >> 0x38);
    local_60.message = extendee;
    local_60.number = number;
    local_60.type = type;
    local_60.is_repeated = is_repeated;
    local_60.is_packed = is_packed;
    anon_unknown_59::Register(&local_60);
    return;
  }
  RegisterEnumExtension();
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         const uint32_t* validation_data) {
  ABSL_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = nullptr;
  info.enum_validity_check.arg = validation_data;
  Register(info);
}